

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnArrayType
          (BinaryReaderIR *this,Index index,TypeMut type_mut)

{
  char *__s;
  Offset OVar1;
  long *plVar2;
  size_t sVar3;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar4;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  long *local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar3 = strlen(__s);
  tVar4.super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       operator_new(0x48);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                  .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) = __s
  ;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) = sVar3;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = OVar1;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
  *(undefined ***)
   tVar4.
   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
   super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       &PTR__TypeModuleField_001986d0;
  MakeUnique<wabt::ArrayType>();
  plVar2 = local_38;
  *(Enum *)((long)local_38 + 0x70) = type_mut.type.enum_.enum_;
  *(byte *)((long)local_38 + 0x74) = type_mut.mutable_ & 1;
  local_38 = (long *)0x0;
  *(long **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                   .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
       plVar2;
  local_40._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_40);
  if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl != (TypeModuleField *)0x0)
  {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8))
              ();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
       (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
       (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)0x0;
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnArrayType(Index index, TypeMut type_mut) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto array_type = MakeUnique<ArrayType>();
  array_type->field.type = type_mut.type;
  array_type->field.mutable_ = type_mut.mutable_;
  field->type = std::move(array_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}